

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_channel_converter_process_pcm_frames
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  uint uVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ma_format mVar6;
  size_t sVar7;
  int iVar8;
  ma_result mVar9;
  ulong uVar10;
  long lVar11;
  ma_uint64 mVar12;
  undefined1 uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined2 uVar16;
  long lVar17;
  ulong uVar18;
  byte *pbVar19;
  float fVar20;
  undefined4 uVar21;
  
  if (pFramesOut == (void *)0x0 || pConverter == (ma_channel_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pFramesIn == (void *)0x0) {
    sVar7 = (*(int *)(&DAT_001908a0 + (ulong)pConverter->format * 4) * pConverter->channelsOut) *
            frameCount;
    if (sVar7 != 0) {
      memset(pFramesOut,0,sVar7);
      return MA_SUCCESS;
    }
  }
  else {
    mVar9 = MA_INVALID_OPERATION;
    switch(pConverter->conversionPath) {
    case ma_channel_conversion_path_passthrough:
      memcpy(pFramesOut,pFramesIn,
             (*(int *)(&DAT_001908a0 + (ulong)pConverter->format * 4) * pConverter->channelsOut) *
             frameCount);
      break;
    case ma_channel_conversion_path_mono_out:
      switch(pConverter->format) {
      case ma_format_u8:
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          uVar4 = 0;
          for (uVar10 = 0; pConverter->channelsIn != uVar10; uVar10 = uVar10 + 1) {
            uVar4 = (uVar4 + *(byte *)((long)pFramesIn + uVar10 + mVar12 * pConverter->channelsIn))
                    - 0x80;
          }
          uVar4 = uVar4 / pConverter->channelsOut;
          if (0x7e < (int)uVar4) {
            uVar4 = 0x7f;
          }
          if ((int)uVar4 < -0x7f) {
            uVar4 = 0xffffff80;
          }
          *(char *)((long)pFramesOut + mVar12) = (char)uVar4 + -0x80;
        }
        break;
      case ma_format_s16:
        lVar11 = 0;
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          uVar4 = pConverter->channelsIn;
          uVar3 = 0;
          for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
            uVar3 = uVar3 + (int)*(short *)((long)pFramesIn + uVar10 * 2 + lVar11 * (ulong)uVar4);
          }
          *(short *)((long)pFramesOut + mVar12 * 2) = (short)(uVar3 / uVar4);
          lVar11 = lVar11 + 2;
        }
        break;
      case ma_format_s24:
        lVar11 = 0;
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          uVar10 = (ulong)pConverter->channelsIn;
          lVar5 = 0;
          for (lVar17 = 0; uVar10 * 3 != lVar17; lVar17 = lVar17 + 3) {
            lVar5 = lVar5 + ((long)((ulong)*(byte *)((long)pFramesIn + lVar17 + lVar11 * uVar10 + 2)
                                    << 0x38 |
                                   (ulong)*(ushort *)((long)pFramesIn + lVar17 + lVar11 * uVar10) <<
                                   0x28) >> 0x28);
          }
          lVar5 = lVar5 / (long)uVar10;
          lVar17 = mVar12 * 3;
          *(char *)((long)pFramesOut + lVar17) = (char)lVar5;
          *(char *)((long)pFramesOut + lVar17 + 1) = (char)((ulong)lVar5 >> 8);
          *(char *)((long)pFramesOut + lVar17 + 2) = (char)((ulong)lVar5 >> 0x10);
          lVar11 = lVar11 + 3;
        }
        break;
      case ma_format_s32:
        lVar11 = 0;
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          uVar10 = (ulong)pConverter->channelsIn;
          lVar5 = 0;
          for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
            lVar5 = lVar5 + *(int *)((long)pFramesIn + uVar18 * 4 + lVar11 * uVar10);
          }
          *(int *)((long)pFramesOut + mVar12 * 4) = (int)(lVar5 / (long)uVar10);
          lVar11 = lVar11 + 4;
        }
        break;
      case ma_format_f32:
        lVar11 = 0;
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          uVar10 = (ulong)pConverter->channelsIn;
          fVar20 = 0.0;
          for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
            fVar20 = fVar20 + *(float *)((long)pFramesIn + uVar18 * 4 + lVar11 * uVar10);
          }
          *(float *)((long)pFramesOut + mVar12 * 4) = fVar20 / (float)uVar10;
          lVar11 = lVar11 + 4;
        }
        break;
      default:
        goto switchD_0015e701_default;
      }
      break;
    case ma_channel_conversion_path_mono_in:
      switch(pConverter->format) {
      case ma_format_u8:
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          for (uVar10 = 0; uVar10 < pConverter->channelsOut; uVar10 = uVar10 + 1) {
            *(undefined1 *)((long)pFramesOut + uVar10 + pConverter->channelsOut * mVar12) =
                 *(undefined1 *)((long)pFramesIn + mVar12);
          }
        }
        break;
      case ma_format_s16:
        uVar10 = (ulong)pConverter->channelsOut;
        if (uVar10 == 2) {
          for (mVar12 = 0; frameCount != mVar12; mVar12 = mVar12 + 1) {
            uVar16 = *(undefined2 *)((long)pFramesIn + mVar12 * 2);
            *(undefined2 *)((long)pFramesOut + mVar12 * 4) = uVar16;
            *(undefined2 *)((long)pFramesOut + mVar12 * 4 + 2) = uVar16;
          }
        }
        else {
          for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
            for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
              *(undefined2 *)((long)pFramesOut + uVar18 * 2) =
                   *(undefined2 *)((long)pFramesIn + mVar12 * 2);
            }
            pFramesOut = (void *)((long)pFramesOut + uVar10 * 2);
          }
        }
        break;
      case ma_format_s24:
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          lVar11 = mVar12 * 3;
          for (uVar10 = 0; uVar10 < pConverter->channelsOut; uVar10 = uVar10 + 1) {
            lVar5 = (pConverter->channelsOut * mVar12 + uVar10) * 3;
            *(undefined1 *)((long)pFramesOut + lVar5) = *(undefined1 *)((long)pFramesIn + lVar11);
            *(undefined1 *)((long)pFramesOut + lVar5 + 1) =
                 *(undefined1 *)((long)pFramesIn + lVar11 + 1);
            *(undefined1 *)((long)pFramesOut + lVar5 + 2) =
                 *(undefined1 *)((long)pFramesIn + lVar11 + 2);
          }
        }
        break;
      case ma_format_s32:
        lVar11 = 0;
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          for (uVar10 = 0; uVar10 < pConverter->channelsOut; uVar10 = uVar10 + 1) {
            *(undefined4 *)((long)pFramesOut + uVar10 * 4 + (ulong)pConverter->channelsOut * lVar11)
                 = *(undefined4 *)((long)pFramesIn + mVar12 * 4);
          }
          lVar11 = lVar11 + 4;
        }
        break;
      case ma_format_f32:
        uVar10 = (ulong)pConverter->channelsOut;
        if (uVar10 == 2) {
          for (mVar12 = 0; frameCount != mVar12; mVar12 = mVar12 + 1) {
            uVar21 = *(undefined4 *)((long)pFramesIn + mVar12 * 4);
            *(undefined4 *)((long)pFramesOut + mVar12 * 8) = uVar21;
            *(undefined4 *)((long)pFramesOut + mVar12 * 8 + 4) = uVar21;
          }
        }
        else {
          for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
            for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
              *(undefined4 *)((long)pFramesOut + uVar18 * 4) =
                   *(undefined4 *)((long)pFramesIn + mVar12 * 4);
            }
            pFramesOut = (void *)((long)pFramesOut + uVar10 * 4);
          }
        }
        break;
      default:
        goto switchD_0015e701_default;
      }
      break;
    case ma_channel_conversion_path_shuffle:
      uVar4 = pConverter->channelsOut;
      uVar10 = (ulong)uVar4;
      pbVar2 = pConverter->pShuffleTable;
      if (pbVar2 == (byte *)0x0 || uVar10 == 0) {
        return MA_INVALID_ARGS;
      }
      if (4 < pConverter->format - ma_format_u8) {
        return MA_INVALID_ARGS;
      }
      uVar3 = pConverter->channelsIn;
      uVar18 = (ulong)uVar3;
      switch(pConverter->format) {
      case ma_format_u8:
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
            if (pbVar2[uVar15] < uVar3) {
              uVar13 = *(undefined1 *)((long)pFramesIn + (ulong)pbVar2[uVar15]);
            }
            else {
              uVar13 = 0;
            }
            *(undefined1 *)((long)pFramesOut + uVar15) = uVar13;
          }
          pFramesOut = (void *)((long)pFramesOut + uVar10);
          pFramesIn = (void *)((long)pFramesIn + uVar18);
        }
        break;
      case ma_format_s16:
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
            if (pbVar2[uVar15] < uVar3) {
              uVar16 = *(undefined2 *)((long)pFramesIn + (ulong)pbVar2[uVar15] * 2);
            }
            else {
              uVar16 = 0;
            }
            *(undefined2 *)((long)pFramesOut + uVar15 * 2) = uVar16;
          }
          pFramesIn = (void *)((long)pFramesIn + uVar18 * 2);
          pFramesOut = (void *)((long)pFramesOut + uVar10 * 2);
        }
        break;
      case ma_format_s24:
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          pbVar19 = pbVar2;
          for (uVar18 = 0; uVar10 * 3 != uVar18; uVar18 = uVar18 + 3) {
            iVar8 = (int)uVar18;
            if (*pbVar19 < uVar3) {
              lVar11 = (ulong)*pbVar19 * 3;
              *(undefined1 *)((long)pFramesOut + (uVar18 & 0xffffffff)) =
                   *(undefined1 *)((long)pFramesIn + lVar11);
              uVar15 = (ulong)(iVar8 + 1);
              *(undefined1 *)((long)pFramesOut + uVar15) =
                   *(undefined1 *)((long)pFramesIn + lVar11 + 1);
              *(undefined1 *)((long)pFramesOut + (ulong)(iVar8 + 2)) =
                   *(undefined1 *)((long)pFramesIn + lVar11 + 2);
            }
            else {
              *(undefined1 *)((long)pFramesOut + (uVar18 & 0xffffffff)) = 0;
              uVar15 = (ulong)(iVar8 + 1);
            }
            *(undefined1 *)((long)pFramesOut + uVar15) = 0;
            pbVar19 = pbVar19 + 1;
          }
          *(undefined1 *)((long)pFramesOut + (ulong)(uVar4 * 3 + 2)) = 0;
          pFramesOut = (void *)((long)pFramesOut + (ulong)(uVar4 * 3));
          pFramesIn = (void *)((long)pFramesIn + (ulong)(uVar3 * 3));
        }
        break;
      case ma_format_s32:
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
            uVar21 = 0;
            if (pbVar2[uVar15] < uVar3) {
              uVar21 = *(undefined4 *)((long)pFramesIn + (ulong)pbVar2[uVar15] * 4);
            }
            *(undefined4 *)((long)pFramesOut + uVar15 * 4) = uVar21;
          }
          pFramesIn = (void *)((long)pFramesIn + uVar18 * 4);
          pFramesOut = (void *)((long)pFramesOut + uVar10 * 4);
        }
        break;
      case ma_format_f32:
        for (mVar12 = 0; mVar12 != frameCount; mVar12 = mVar12 + 1) {
          for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
            uVar21 = 0;
            if (pbVar2[uVar15] < uVar3) {
              uVar21 = *(undefined4 *)((long)pFramesIn + (ulong)pbVar2[uVar15] * 4);
            }
            *(undefined4 *)((long)pFramesOut + uVar15 * 4) = uVar21;
          }
          pFramesIn = (void *)((long)pFramesIn + uVar18 * 4);
          pFramesOut = (void *)((long)pFramesOut + uVar10 * 4);
        }
      }
      break;
    default:
      mVar6 = pConverter->format;
      sVar7 = (*(int *)(&DAT_001908a0 + (ulong)mVar6 * 4) * pConverter->channelsOut) * frameCount;
      if (sVar7 != 0) {
        memset(pFramesOut,0,sVar7);
        mVar6 = pConverter->format;
      }
      switch(mVar6) {
      case ma_format_u8:
        for (uVar4 = 0; uVar4 < frameCount; uVar4 = uVar4 + 1) {
          for (uVar10 = 0; uVar10 < pConverter->channelsIn; uVar10 = uVar10 + 1) {
            for (uVar18 = 0; uVar18 < pConverter->channelsOut; uVar18 = uVar18 + 1) {
              uVar15 = (ulong)(pConverter->channelsOut * uVar4 + (int)uVar18);
              iVar8 = ((int)((*(byte *)((long)pFramesIn +
                                       (ulong)(pConverter->channelsIn * uVar4 + (int)uVar10)) - 0x80
                             ) * (int)(pConverter->weights).f32[uVar10][uVar18]) >> 0xc) +
                      (uint)*(byte *)((long)pFramesOut + uVar15) + -0x80;
              if (iVar8 < -0x7f) {
                iVar8 = -0x80;
              }
              if (0x7e < iVar8) {
                iVar8 = 0x7f;
              }
              *(char *)((long)pFramesOut + uVar15) = (char)iVar8 + -0x80;
            }
          }
        }
        break;
      case ma_format_s16:
        for (uVar4 = 0; uVar4 < frameCount; uVar4 = uVar4 + 1) {
          uVar3 = pConverter->channelsIn;
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            uVar1 = pConverter->channelsOut;
            for (uVar18 = 0; uVar1 != uVar18; uVar18 = uVar18 + 1) {
              uVar15 = (ulong)(uVar4 * uVar1 + (int)uVar18);
              iVar8 = ((int)*(short *)((long)pFramesIn + (ulong)(uVar3 * uVar4 + (int)uVar10) * 2) *
                       (int)(pConverter->weights).f32[uVar10][uVar18] >> 0xc) +
                      (int)*(short *)((long)pFramesOut + uVar15 * 2);
              if (0x7ffe < iVar8) {
                iVar8 = 0x7fff;
              }
              if (iVar8 < -0x7fff) {
                iVar8 = -0x8000;
              }
              *(short *)((long)pFramesOut + uVar15 * 2) = (short)iVar8;
            }
          }
        }
        break;
      case ma_format_s24:
        for (uVar4 = 0; uVar4 < frameCount; uVar4 = uVar4 + 1) {
          for (uVar10 = 0; uVar10 < pConverter->channelsIn; uVar10 = uVar10 + 1) {
            for (uVar18 = 0; uVar18 < pConverter->channelsOut; uVar18 = uVar18 + 1) {
              uVar15 = (ulong)((pConverter->channelsOut * uVar4 + (int)uVar18) * 3);
              uVar14 = (ulong)((pConverter->channelsIn * uVar4 + (int)uVar10) * 3);
              lVar11 = ((long)(int)(pConverter->weights).f32[uVar10][uVar18] *
                        ((long)((ulong)*(byte *)((long)pFramesIn + uVar14 + 2) << 0x38 |
                               (ulong)*(ushort *)((long)pFramesIn + uVar14) << 0x28) >> 0x28) >> 0xc
                       ) + ((long)((ulong)*(byte *)((long)pFramesOut + uVar15 + 2) << 0x38 |
                                  (ulong)*(ushort *)((long)pFramesOut + uVar15) << 0x28) >> 0x28);
              if (lVar11 < -0x7fffff) {
                lVar11 = -0x800000;
              }
              if (0x7ffffe < lVar11) {
                lVar11 = 0x7fffff;
              }
              *(char *)((long)pFramesOut + uVar15) = (char)lVar11;
              *(char *)((long)pFramesOut + uVar15 + 1) = (char)((ulong)lVar11 >> 8);
              *(char *)((long)pFramesOut + uVar15 + 2) = (char)((ulong)lVar11 >> 0x10);
            }
          }
        }
        break;
      case ma_format_s32:
        for (uVar4 = 0; uVar4 < frameCount; uVar4 = uVar4 + 1) {
          for (uVar10 = 0; uVar10 < pConverter->channelsIn; uVar10 = uVar10 + 1) {
            for (uVar18 = 0; uVar18 < pConverter->channelsOut; uVar18 = uVar18 + 1) {
              uVar15 = (ulong)(pConverter->channelsOut * uVar4 + (int)uVar18);
              lVar11 = ((long)(int)(pConverter->weights).f32[uVar10][uVar18] *
                        (long)*(int *)((long)pFramesIn +
                                      (ulong)(pConverter->channelsIn * uVar4 + (int)uVar10) * 4) >>
                       0xc) + (long)*(int *)((long)pFramesOut + uVar15 * 4);
              if (0x7ffffffe < lVar11) {
                lVar11 = 0x7fffffff;
              }
              if (lVar11 < -0x7fffffff) {
                lVar11 = -0x80000000;
              }
              *(int *)((long)pFramesOut + uVar15 * 4) = (int)lVar11;
            }
          }
        }
        break;
      case ma_format_f32:
        for (uVar4 = 0; uVar4 < frameCount; uVar4 = uVar4 + 1) {
          uVar3 = pConverter->channelsIn;
          for (uVar10 = 0; uVar10 != uVar3; uVar10 = uVar10 + 1) {
            uVar1 = pConverter->channelsOut;
            for (uVar18 = 0; uVar1 != uVar18; uVar18 = uVar18 + 1) {
              uVar15 = (ulong)(uVar4 * uVar1 + (int)uVar18);
              *(float *)((long)pFramesOut + uVar15 * 4) =
                   *(float *)((long)pFramesIn + (ulong)(uVar3 * uVar4 + (int)uVar10) * 4) *
                   (pConverter->weights).f32[uVar10][uVar18] +
                   *(float *)((long)pFramesOut + uVar15 * 4);
            }
          }
        }
        break;
      default:
        goto switchD_0015e701_default;
      }
    }
  }
  mVar9 = MA_SUCCESS;
switchD_0015e701_default:
  return mVar9;
}

Assistant:

MA_API ma_result ma_channel_converter_process_pcm_frames(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFramesOut == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFramesIn == NULL) {
        ma_zero_memory_64(pFramesOut, frameCount * ma_get_bytes_per_frame(pConverter->format, pConverter->channelsOut));
        return MA_SUCCESS;
    }

    switch (pConverter->conversionPath)
    {
        case ma_channel_conversion_path_passthrough: return ma_channel_converter_process_pcm_frames__passthrough(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_mono_out:    return ma_channel_converter_process_pcm_frames__mono_out(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_mono_in:     return ma_channel_converter_process_pcm_frames__mono_in(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_shuffle:     return ma_channel_converter_process_pcm_frames__shuffle(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_weights:
        default:
        {
            return ma_channel_converter_process_pcm_frames__weights(pConverter, pFramesOut, pFramesIn, frameCount);
        }
    }
}